

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::CZString::CZString(CZString *this,CZString *other)

{
  long *in_RSI;
  long *in_RDI;
  uint local_2c;
  char *local_20;
  
  if (((int)in_RSI[1] == 0) || (*in_RSI == 0)) {
    local_20 = (char *)*in_RSI;
  }
  else {
    local_20 = duplicateStringValue((char *)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  }
  *in_RDI = (long)local_20;
  if (*in_RSI == 0) {
    local_2c = *(uint *)(in_RSI + 1);
  }
  else {
    local_2c = (uint)((int)in_RSI[1] != 0);
  }
  *(uint *)(in_RDI + 1) = local_2c;
  return;
}

Assistant:

Value::CZString::CZString(const CZString& other)
    : cstr_(other.index_ != noDuplication && other.cstr_ != 0
                ? duplicateStringValue(other.cstr_)
                : other.cstr_),
      index_(other.cstr_
                 ? (other.index_ == noDuplication ? noDuplication : duplicate)
                 : other.index_) {}